

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iunk.c
# Opt level: O0

int envy_bios_parse_iunk21(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_iunk21 *peVar5;
  envy_bios_iunk21_entry *peVar6;
  envy_bios_iunk21_entry *entry;
  int i;
  int wantrlen;
  int wanthlen;
  int err;
  envy_bios_iunk21 *iunk21;
  envy_bios *bios_local;
  
  peVar5 = &bios->iunk21;
  if (peVar5->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    iVar1 = bios_u8(bios,(uint)peVar5->offset,&(bios->iunk21).version);
    iVar2 = bios_u8(bios,peVar5->offset + 1,&(bios->iunk21).hlen);
    iVar3 = bios_u8(bios,peVar5->offset + 2,&(bios->iunk21).rlen);
    iVar4 = bios_u8(bios,peVar5->offset + 3,&(bios->iunk21).entriesnum);
    if (iVar4 == 0 && (iVar3 == 0 && (iVar2 == 0 && iVar1 == 0))) {
      envy_bios_block(bios,(uint)peVar5->offset,
                      (uint)(bios->iunk21).hlen +
                      (uint)(bios->iunk21).rlen * (uint)(bios->iunk21).entriesnum,"IUNK21",-1);
      if ((bios->iunk21).version == '\x10') {
        if ((bios->iunk21).hlen < 4) {
          fprintf(_stderr,"IUNK21 table header too short [%d < %d]\n",(ulong)(bios->iunk21).hlen,4);
          bios_local._4_4_ = -0x16;
        }
        else if ((bios->iunk21).rlen < 3) {
          fprintf(_stderr,"IUNK21 table record too short [%d < %d]\n",(ulong)(bios->iunk21).rlen,3);
          bios_local._4_4_ = -0x16;
        }
        else {
          if (4 < (bios->iunk21).hlen) {
            fprintf(_stderr,"IUNK21 table header longer than expected [%d > %d]\n",
                    (ulong)(bios->iunk21).hlen,4);
          }
          if (3 < (bios->iunk21).rlen) {
            fprintf(_stderr,"IUNK21 table record longer than expected [%d > %d]\n",
                    (ulong)(bios->iunk21).rlen,3);
          }
          peVar6 = (envy_bios_iunk21_entry *)calloc((ulong)(bios->iunk21).entriesnum,8);
          (bios->iunk21).entries = peVar6;
          if ((bios->iunk21).entries == (envy_bios_iunk21_entry *)0x0) {
            bios_local._4_4_ = -0xc;
          }
          else {
            for (entry._0_4_ = 0; (int)entry < (int)(uint)(bios->iunk21).entriesnum;
                entry._0_4_ = (int)entry + 1) {
              (bios->iunk21).entries[(int)entry].offset =
                   peVar5->offset + (ushort)(bios->iunk21).hlen +
                   (ushort)(bios->iunk21).rlen * (short)(int)entry;
              if (iVar4 != 0 || (iVar3 != 0 || (iVar2 != 0 || iVar1 != 0))) {
                return -0xe;
              }
            }
            (bios->iunk21).valid = '\x01';
            bios_local._4_4_ = 0;
          }
        }
      }
      else {
        fprintf(_stderr,"Unknown IUNK21 table version %d.%d\n",
                (ulong)(uint)((int)(uint)(bios->iunk21).version >> 4),
                (ulong)((bios->iunk21).version & 0xf));
        bios_local._4_4_ = -0x16;
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_iunk21 (struct envy_bios *bios) {
	struct envy_bios_iunk21 *iunk21 = &bios->iunk21;
	if (!iunk21->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, iunk21->offset, &iunk21->version);
	err |= bios_u8(bios, iunk21->offset+1, &iunk21->hlen);
	err |= bios_u8(bios, iunk21->offset+2, &iunk21->rlen);
	err |= bios_u8(bios, iunk21->offset+3, &iunk21->entriesnum);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, iunk21->offset, iunk21->hlen + iunk21->rlen * iunk21->entriesnum, "IUNK21", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (iunk21->version) {
		case 0x10:
			wanthlen = 4;
			wantrlen = 3;
			break;
		default:
			ENVY_BIOS_ERR("Unknown IUNK21 table version %d.%d\n", iunk21->version >> 4, iunk21->version & 0xf);
			return -EINVAL;
	}
	if (iunk21->hlen < wanthlen) {
		ENVY_BIOS_ERR("IUNK21 table header too short [%d < %d]\n", iunk21->hlen, wanthlen);
		return -EINVAL;
	}
	if (iunk21->rlen < wantrlen) {
		ENVY_BIOS_ERR("IUNK21 table record too short [%d < %d]\n", iunk21->rlen, wantrlen);
		return -EINVAL;
	}
	if (iunk21->hlen > wanthlen) {
		ENVY_BIOS_WARN("IUNK21 table header longer than expected [%d > %d]\n", iunk21->hlen, wanthlen);
	}
	if (iunk21->rlen > wantrlen) {
		ENVY_BIOS_WARN("IUNK21 table record longer than expected [%d > %d]\n", iunk21->rlen, wantrlen);
	}
	iunk21->entries = calloc(iunk21->entriesnum, sizeof *iunk21->entries);
	if (!iunk21->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < iunk21->entriesnum; i++) {
		struct envy_bios_iunk21_entry *entry = &iunk21->entries[i];
		entry->offset = iunk21->offset + iunk21->hlen + iunk21->rlen * i;
		/* XXX */
		if (err)
			return -EFAULT;
	}
	iunk21->valid = 1;
	return 0;
}